

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

xml_node __thiscall pugi::xml_node::insert_copy_after(xml_node *this,xml_node *proto,xml_node *node)

{
  ulong uVar1;
  xml_allocator *this_00;
  xml_node_struct *pxVar2;
  xml_node_struct *pxVar3;
  xml_node_struct *pxVar4;
  uint uVar5;
  xml_node_struct *pxVar6;
  uint uVar7;
  xml_node n;
  xml_node local_28;
  xml_node local_20;
  
  uVar5 = 0;
  uVar7 = 0;
  if (proto->_root != (xml_node_struct *)0x0) {
    uVar7 = (uint)proto->_root->header & 0xf;
  }
  pxVar4 = this->_root;
  if (pxVar4 != (xml_node_struct *)0x0) {
    uVar5 = (uint)pxVar4->header & 0xf;
  }
  if ((((1 < uVar7) && (0xfffffffd < uVar5 - 3)) && ((uVar7 - 9 < 0xfffffffe || (uVar5 == 1)))) &&
     ((node->_root != (xml_node_struct *)0x0 && (node->_root->parent == pxVar4)))) {
    if (pxVar4 == (xml_node_struct *)0x0) {
      __assert_fail("object",
                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                    ,0x496,
                    "xml_allocator &pugi::impl::(anonymous namespace)::get_allocator(const Object *) [Object = pugi::xml_node_struct]"
                   );
    }
    this_00 = *(xml_allocator **)((long)pxVar4 - (pxVar4->header >> 8));
    uVar1 = this_00->_busy_size + 0x40;
    if (uVar1 < 0x7fd9) {
      local_20._root = (xml_node_struct *)this_00->_root;
      pxVar4 = (xml_node_struct *)((long)&(local_20._root)->prev_sibling_c + this_00->_busy_size);
      this_00->_busy_size = uVar1;
    }
    else {
      pxVar4 = (xml_node_struct *)
               impl::anon_unknown_0::xml_allocator::allocate_memory_oob
                         (this_00,0x40,(xml_memory_page **)&local_20);
    }
    if (pxVar4 == (xml_node_struct *)0x0) {
      pxVar4 = (xml_node_struct *)0x0;
    }
    else {
      pxVar4->prev_sibling_c = (xml_node_struct *)0x0;
      pxVar4->next_sibling = (xml_node_struct *)0x0;
      pxVar4->parent = (xml_node_struct *)0x0;
      pxVar4->first_child = (xml_node_struct *)0x0;
      pxVar4->name = (char_t *)0x0;
      pxVar4->value = (char_t *)0x0;
      pxVar4->first_attribute = (xml_attribute_struct *)0x0;
      pxVar4->header = (ulong)uVar7 | ((long)pxVar4 - (long)local_20._root) * 0x100;
    }
    xml_node(&local_20,pxVar4);
    if (local_20._root != (xml_node_struct *)0x0) {
      pxVar4 = node->_root;
      pxVar2 = pxVar4->parent;
      (local_20._root)->parent = pxVar2;
      pxVar3 = pxVar4->next_sibling;
      pxVar6 = pxVar3;
      if (pxVar3 == (xml_node_struct *)0x0) {
        pxVar6 = pxVar2->first_child;
      }
      pxVar6->prev_sibling_c = local_20._root;
      (local_20._root)->next_sibling = pxVar3;
      (local_20._root)->prev_sibling_c = pxVar4;
      pxVar4->next_sibling = local_20._root;
      impl::anon_unknown_0::node_copy_tree(local_20._root,proto->_root);
      return (xml_node)local_20._root;
    }
  }
  xml_node(&local_28);
  return (xml_node)local_28._root;
}

Assistant:

PUGI_IMPL_FN xml_node xml_node::insert_copy_after(const xml_node& proto, const xml_node& node)
	{
		xml_node_type type_ = proto.type();
		if (!impl::allow_insert_child(type(), type_)) return xml_node();
		if (!node._root || node._root->parent != _root) return xml_node();

		impl::xml_allocator& alloc = impl::get_allocator(_root);
		if (!alloc.reserve()) return xml_node();

		xml_node n(impl::allocate_node(alloc, type_));
		if (!n) return xml_node();

		impl::insert_node_after(n._root, node._root);
		impl::node_copy_tree(n._root, proto._root);

		return n;
	}